

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweepManager.cpp
# Opt level: O2

bool __thiscall Memory::RecyclerSweepManager::AdjustPartialHeuristics(RecyclerSweepManager *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  Recycler *pRVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  
  if (this->recycler->inPartialCollectMode == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x19f,"(recycler->inPartialCollectMode)","recycler->inPartialCollectMode");
    if (!bVar2) goto LAB_0069cd5d;
    *puVar3 = 0;
  }
  if (this->adjustPartialHeuristics == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x1a0,"(this->adjustPartialHeuristics)","this->adjustPartialHeuristics");
    if (!bVar2) goto LAB_0069cd5d;
    *puVar3 = 0;
  }
  if ((this->inPartialCollect == false) &&
     ((this->recycler->autoHeap).unusedPartialCollectFreeBytes != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x1a1,
                       "(this->InPartialCollect() || recycler->autoHeap.unusedPartialCollectFreeBytes == 0)"
                       ,
                       "this->InPartialCollect() || recycler->autoHeap.unusedPartialCollectFreeBytes == 0"
                      );
    if (!bVar2) goto LAB_0069cd5d;
    *puVar3 = 0;
  }
  if (0x500000 < this->rescanRootBytes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x1a4,"(this->rescanRootBytes <= (size_t)MaxPartialCollectRescanRootBytes)",
                       "this->rescanRootBytes <= (size_t)MaxPartialCollectRescanRootBytes");
    if (!bVar2) goto LAB_0069cd5d;
    *puVar3 = 0;
  }
  if (0x1000000 < (this->recycler->autoHeap).unusedPartialCollectFreeBytes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x1a5,
                       "(recycler->autoHeap.unusedPartialCollectFreeBytes <= MaxUnusedPartialCollectFreeBytes)"
                       ,
                       "recycler->autoHeap.unusedPartialCollectFreeBytes <= MaxUnusedPartialCollectFreeBytes"
                      );
    if (!bVar2) goto LAB_0069cd5d;
    *puVar3 = 0;
  }
  sVar4 = GetNewObjectAllocBytes(this);
  if (sVar4 == 0) {
    uVar6 = 0;
    dVar14 = 1.0;
  }
  else {
    sVar5 = GetNewObjectFreeBytes(this);
    if (sVar4 < sVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                         ,0x1b3,"(freedBytes <= allocBytes)","freedBytes <= allocBytes");
      if (!bVar2) goto LAB_0069cd5d;
      *puVar3 = 0;
    }
    auVar15._8_4_ = (int)(sVar5 >> 0x20);
    auVar15._0_8_ = sVar5;
    auVar15._12_4_ = 0x45300000;
    auVar12._8_4_ = (int)(sVar4 >> 0x20);
    auVar12._0_8_ = sVar4;
    auVar12._12_4_ = 0x45300000;
    dVar14 = (((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0) +
             (auVar15._8_8_ - 1.9342813113834067e+25)) /
             (((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0) +
             (auVar12._8_8_ - 1.9342813113834067e+25));
    if (dVar14 < 0.1) {
      return false;
    }
    dVar14 = (dVar14 + -0.1) / 0.9;
    if (1.0 < dVar14) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                         ,0x1c4,"(collectEfficacy <= 1.0)","collectEfficacy <= 1.0");
      if (!bVar2) goto LAB_0069cd5d;
      *puVar3 = 0;
    }
    uVar6 = (ulong)(dVar14 * 4096.0);
    uVar6 = (long)(dVar14 * 4096.0 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6;
  }
  this->partialCollectSmallHeapBlockReuseMinFreeBytes = uVar6;
  pRVar7 = this->recycler;
  (pRVar7->collectionStats).collectEfficacy = dVar14;
  (pRVar7->collectionStats).partialCollectSmallHeapBlockReuseMinFreeBytes = uVar6;
  auVar11._0_8_ = (double)CONCAT44(0x43300000,(int)this->reuseHeapBlockCount);
  auVar11._8_4_ = (int)(this->reuseHeapBlockCount >> 0x20);
  auVar11._12_4_ = 0x45300000;
  dVar16 = 1.0 - dVar14;
  dVar10 = ((auVar11._0_8_ - 4503599627370496.0) + (auVar11._8_8_ - 1.9342813113834067e+25)) *
           dVar16;
  uVar6 = (ulong)dVar10;
  uVar9 = ((long)(dVar10 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6) * 0x1000;
  uVar6 = this->rescanRootBytes;
  if (this->rescanRootBytes <= uVar9) {
    uVar6 = uVar9;
  }
  (pRVar7->collectionStats).estimatedPartialReuseBytes = uVar9;
  if (uVar6 < 0x500001) {
    (pRVar7->collectionStats).collectCost = (double)(long)uVar6 / 5242880.0;
    dVar14 = ((double)(long)uVar6 / 5242880.0) * dVar14 + dVar16;
    if (this->inPartialCollect == true) {
      if ((ulong)RecyclerHeuristic::Instance.MaxUncollectedAllocBytesPartialCollect <
          this->nextPartialUncollectedAllocBytes) {
        return false;
      }
      sVar4 = (pRVar7->autoHeap).unusedPartialCollectFreeBytes;
      auVar13._0_8_ = (double)CONCAT44(0x43300000,(int)sVar4);
      auVar13._8_4_ = (int)(sVar4 >> 0x20);
      auVar13._12_4_ = 0x45300000;
      dVar10 = (double)(long)this->nextPartialUncollectedAllocBytes /
               (double)RecyclerHeuristic::Instance.MaxUncollectedAllocBytesPartialCollect;
      dVar10 = (1.0 - dVar10) *
               ((auVar13._0_8_ - 4503599627370496.0) + (auVar13._8_8_ - 1.9342813113834067e+25)) *
               5.9604644775390625e-08 + dVar10;
      dVar14 = dVar14 * (1.0 - dVar10) + dVar10;
    }
    if ((dVar14 < 0.0) || (1.0 < dVar14)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                         ,0x1f7,"(0.0 <= ratio && ratio <= 1.0)","0.0 <= ratio && ratio <= 1.0");
      if (!bVar2) goto LAB_0069cd5d;
      *puVar3 = 0;
      pRVar7 = this->recycler;
    }
    uVar8 = (ulong)RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount;
    dVar10 = (double)(RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount - 0x400) *
             dVar14;
    uVar9 = (ulong)dVar10;
    uVar9 = (long)(dVar10 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9;
    uVar6 = uVar9 + 0x400;
    pRVar7->uncollectedNewPageCountPartialCollect = uVar6;
    if (0xfffffffffffffbff < uVar9 || uVar8 < uVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                         ,0x1fe,
                         "(recycler->uncollectedNewPageCountPartialCollect >= MinPartialUncollectedNewPageCount && recycler->uncollectedNewPageCountPartialCollect <= RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount)"
                         ,
                         "recycler->uncollectedNewPageCountPartialCollect >= MinPartialUncollectedNewPageCount && recycler->uncollectedNewPageCountPartialCollect <= RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount"
                        );
      if (!bVar2) {
LAB_0069cd5d:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      pRVar7 = this->recycler;
      uVar6 = pRVar7->uncollectedNewPageCountPartialCollect;
    }
    dVar16 = dVar16 * (((double)CONCAT44(0x43300000,(int)this->reuseByteCount) - 4503599627370496.0)
                      + ((double)CONCAT44(0x45300000,(int)(this->reuseByteCount >> 0x20)) -
                        1.9342813113834067e+25));
    uVar9 = (ulong)dVar16;
    if (uVar6 * 0x1000 + this->nextPartialUncollectedAllocBytes +
        ((long)(dVar16 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9) <
        (ulong)RecyclerHeuristic::Instance.MaxUncollectedAllocBytesPartialCollect) {
      bVar2 = RecyclerHeuristic::PartialConcurrentNextCollection(dVar14,pRVar7->recyclerFlagsTable);
      this->recycler->partialConcurrentNextCollection = bVar2;
      return true;
    }
  }
  return false;
}

Assistant:

bool
RecyclerSweepManager::AdjustPartialHeuristics()
{
    Assert(recycler->inPartialCollectMode);
    Assert(this->adjustPartialHeuristics);
    Assert(this->InPartialCollect() || recycler->autoHeap.unusedPartialCollectFreeBytes == 0);

    // DoPartialCollectMode should have rejected these already
    Assert(this->rescanRootBytes <= (size_t)MaxPartialCollectRescanRootBytes);
    Assert(recycler->autoHeap.unusedPartialCollectFreeBytes <= MaxUnusedPartialCollectFreeBytes);

    // Page reuse Heuristics
    double collectEfficacy;
    const size_t allocBytes = this->GetNewObjectAllocBytes();
    if (allocBytes == 0)
    {
        // We may get collections without allocating memory (e.g. unpin heuristics).
        collectEfficacy = 1.0;                                          // assume 100% efficacy
        this->partialCollectSmallHeapBlockReuseMinFreeBytes = 0;    // reuse all pages
    }
    else
    {
        const size_t freedBytes = this->GetNewObjectFreeBytes();
        Assert(freedBytes <= allocBytes);

        collectEfficacy = (double)freedBytes / (double)allocBytes;

        // If we collected less then 10% of the memory, let's not do partial GC.
        // CONSIDER: It may be good to do partial with low efficacy once we have concurrent partial
        // because old object are not getting collected as well, but without concurrent partial, we will have to mark
        // new objects in thread.
        if (collectEfficacy < MinPartialCollectEfficacy)
        {
            return false;
        }

        // Scale the efficacy linearly such that an efficacy of MinPartialCollectEfficacy translates to an adjusted efficacy of
        // 0.0, and an efficacy of 1.0 translates to an adjusted efficacy of 1.0
        collectEfficacy = (collectEfficacy - MinPartialCollectEfficacy) / (1.0 - MinPartialCollectEfficacy);

        Assert(collectEfficacy <= 1.0);
        this->partialCollectSmallHeapBlockReuseMinFreeBytes = (size_t)(AutoSystemInfo::PageSize * collectEfficacy);
    }
#ifdef RECYCLER_STATS
    recycler->collectionStats.collectEfficacy = collectEfficacy;
    recycler->collectionStats.partialCollectSmallHeapBlockReuseMinFreeBytes = this->partialCollectSmallHeapBlockReuseMinFreeBytes;
#endif

    // Blocks which are being reused are likely to be touched again from allocation and contribute to Rescan cost.
    // If there are many of these, adjust rescanRootBytes to account for this.
    const size_t estimatedPartialReuseBlocks = (size_t)((double)this->reuseHeapBlockCount * (1.0 - collectEfficacy));
    const size_t estimatedPartialReuseBytes = estimatedPartialReuseBlocks * AutoSystemInfo::PageSize;

    const size_t newRescanRootBytes = max(this->rescanRootBytes, estimatedPartialReuseBytes);

    RECYCLER_STATS_SET(recycler, estimatedPartialReuseBytes, estimatedPartialReuseBytes);

    // Recheck the rescanRootBytes
    if (newRescanRootBytes > MaxPartialCollectRescanRootBytes)
    {
        return false;
    }

    double collectCost = (double)newRescanRootBytes / MaxPartialCollectRescanRootBytes;

    RECYCLER_STATS_SET(recycler, collectCost, collectCost);

    // Include the efficacy in equal portion, which is related to the cost of marking through new objects.
    // r = c * e + 1 - e;
    const double reuseRatio = 1.0 - collectEfficacy;
    double ratio = collectCost * collectEfficacy + reuseRatio;

    if (this->InPartialCollect())
    {
        // Avoid ratio of uncollectedBytesPressure > 1.0
        if (this->nextPartialUncollectedAllocBytes > RecyclerHeuristic::Instance.MaxUncollectedAllocBytesPartialCollect)
        {
            return false;
        }

        // Only add full collect pressure if we are doing partial collect,
        // account for the amount of uncollected bytes and unused bytes to increase
        // pressure to do a full GC by rising the partial GC new page heuristic

        double uncollectedBytesPressure = (double)this->nextPartialUncollectedAllocBytes / (double)RecyclerHeuristic::Instance.MaxUncollectedAllocBytesPartialCollect;
        double collectFullCollectPressure =
            (double)recycler->autoHeap.unusedPartialCollectFreeBytes / (double)MaxUnusedPartialCollectFreeBytes
            * (1.0 - uncollectedBytesPressure) + uncollectedBytesPressure;

        ratio = ratio * (1.0 - collectFullCollectPressure) + collectFullCollectPressure;
    }
    Assert(0.0 <= ratio && ratio <= 1.0);

    // Linear scale the partial GC new page heuristic using the ratio calculated
    recycler->uncollectedNewPageCountPartialCollect = MinPartialUncollectedNewPageCount
        + (size_t)((double)(RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount - MinPartialUncollectedNewPageCount) * ratio);

    Assert(recycler->uncollectedNewPageCountPartialCollect >= MinPartialUncollectedNewPageCount &&
        recycler->uncollectedNewPageCountPartialCollect <= RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount);

    // If the number of new page to reach the partial heuristics plus the existing uncollectedAllocBytes
    // and the memory we are going to reuse (assume we use it all) is greater then the full GC max size heuristic
    // (with 1M fudge factor), we trigger a full GC anyways, so let's not get into partial GC
    const size_t estimatedPartialReusedFreeByteCount = (size_t)((double)this->reuseByteCount * reuseRatio);
    if (recycler->uncollectedNewPageCountPartialCollect * AutoSystemInfo::PageSize
        + this->nextPartialUncollectedAllocBytes + estimatedPartialReusedFreeByteCount >= RecyclerHeuristic::Instance.MaxUncollectedAllocBytesPartialCollect)
    {
        return false;
    }

#if ENABLE_CONCURRENT_GC
    recycler->partialConcurrentNextCollection = RecyclerHeuristic::PartialConcurrentNextCollection(ratio, recycler->GetRecyclerFlagsTable());
#endif
    return true;
}